

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersector1<4,_1,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  int iVar6;
  int iVar7;
  undefined1 (*pauVar8) [16];
  undefined4 uVar9;
  Geometry *pGVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  float fVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  float fVar55;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar80;
  float fVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar121 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar128 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1259;
  ulong local_1258;
  ulong local_1250;
  long local_1248;
  float fStack_1240;
  float fStack_123c;
  int local_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [16];
  ulong local_11d0;
  RayHit *local_11c8;
  RayQueryContext *local_11c0;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  ulong local_1180;
  RTCFilterFunctionNArguments local_1178;
  float local_1148;
  float local_1144;
  float local_1140;
  undefined4 local_113c;
  float local_1138;
  undefined4 local_1134;
  uint local_1130;
  uint local_112c;
  uint local_1128;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [12];
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 *local_10c8;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088 [4];
  float local_1078 [4];
  float local_1068 [4];
  float local_1058 [4];
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar17 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar118 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar40 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar41 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar42 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar126 = (ray->super_RayK<1>).tfar;
    fVar131 = 0.0;
    if (0.0 <= fVar126) {
      fVar131 = fVar126;
    }
    uVar23 = -(uint)(1e-18 <= ABS(aVar5.x));
    uVar25 = -(uint)(1e-18 <= ABS(aVar5.y));
    uVar29 = -(uint)(1e-18 <= ABS(aVar5.z));
    auVar75 = divps(_DAT_01f46a60,(undefined1  [16])aVar5);
    fVar112 = (float)(~uVar23 & 0x5d5e0b6b | auVar75._0_4_ & uVar23);
    fVar113 = (float)(~uVar25 & 0x5d5e0b6b | auVar75._4_4_ & uVar25);
    fVar114 = (float)(~uVar29 & 0x5d5e0b6b | auVar75._8_4_ & uVar29);
    fVar119 = fVar112 * 0.99999964;
    fVar122 = fVar113 * 0.99999964;
    fVar124 = fVar114 * 0.99999964;
    fVar112 = fVar112 * 1.0000004;
    fVar113 = fVar113 * 1.0000004;
    fVar114 = fVar114 * 1.0000004;
    fVar126 = 0.0;
    if (0.0 <= fVar42) {
      fVar126 = fVar42;
    }
    uVar16 = (ulong)(fVar119 < 0.0) << 4;
    uVar14 = (ulong)(fVar122 < 0.0) << 4 | 0x20;
    uVar15 = (ulong)(fVar124 < 0.0) << 4 | 0x40;
    uVar18 = uVar16 ^ 0x10;
    uVar13 = uVar14 ^ 0x10;
    uVar22 = uVar15 ^ 0x10;
    auVar75._4_4_ = fVar126;
    auVar75._0_4_ = fVar126;
    auVar75._8_4_ = fVar126;
    auVar75._12_4_ = fVar126;
    auVar87._4_4_ = fVar131;
    auVar87._0_4_ = fVar131;
    auVar87._8_4_ = fVar131;
    auVar87._12_4_ = fVar131;
    _local_1048 = mm_lookupmask_ps._240_8_;
    _uStack_1040 = mm_lookupmask_ps._248_8_;
    local_11c0 = context;
    local_11c8 = ray;
    local_11d0 = uVar16;
    local_fd8 = fVar41;
    fStack_fd4 = fVar41;
    fStack_fd0 = fVar41;
    fStack_fcc = fVar41;
    local_fe8 = fVar114;
    fStack_fe4 = fVar114;
    fStack_fe0 = fVar114;
    fStack_fdc = fVar114;
    local_ff8 = auVar75;
    local_1008 = fVar124;
    fStack_1004 = fVar124;
    fStack_1000 = fVar124;
    fStack_ffc = fVar124;
    local_1018 = fVar118;
    fStack_1014 = fVar118;
    fStack_1010 = fVar118;
    fStack_100c = fVar118;
    local_1028 = fVar40;
    fStack_1024 = fVar40;
    fStack_1020 = fVar40;
    fStack_101c = fVar40;
    local_1038 = fVar119;
    fStack_1034 = fVar119;
    fStack_1030 = fVar119;
    fStack_102c = fVar119;
    local_1108 = fVar122;
    fStack_1104 = fVar122;
    fStack_1100 = fVar122;
    fStack_10fc = fVar122;
    local_1118 = fVar112;
    fStack_1114 = fVar112;
    fStack_1110 = fVar112;
    fStack_110c = fVar112;
    local_1198 = fVar113;
    fStack_1194 = fVar113;
    fStack_1190 = fVar113;
    fStack_118c = fVar113;
    fVar126 = fVar41;
    fVar131 = fVar41;
    fVar42 = fVar41;
    fVar55 = fVar113;
    fVar56 = fVar113;
    fVar57 = fVar113;
    fVar58 = fVar122;
    fVar59 = fVar122;
    fVar60 = fVar122;
    fVar74 = fVar112;
    fVar80 = fVar112;
    fVar81 = fVar112;
    fVar82 = fVar114;
    fVar83 = fVar114;
    fVar89 = fVar114;
    fVar92 = fVar124;
    fVar93 = fVar124;
    fVar94 = fVar124;
    fVar95 = fVar118;
    fVar96 = fVar118;
    fVar97 = fVar118;
    fVar98 = fVar40;
    fVar99 = fVar40;
    fVar100 = fVar40;
    fVar101 = fVar119;
    fVar102 = fVar119;
    fVar103 = fVar119;
    local_1258 = uVar15;
    local_1250 = uVar14;
LAB_0056e168:
    if (pauVar17 != (undefined1 (*) [16])&local_f78) {
      pauVar8 = pauVar17 + -1;
      pauVar17 = pauVar17 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar8 + 8) < *pfVar1 || *(float *)((long)*pauVar8 + 8) == *pfVar1) {
        pauVar8 = (undefined1 (*) [16])&local_f78;
        pauVar19 = *(undefined1 (**) [16])*pauVar17;
        while (((ulong)pauVar19 & 8) == 0) {
          pfVar1 = (float *)((long)pauVar19[2] + uVar16);
          auVar43._0_4_ = (*pfVar1 - fVar118) * fVar119;
          auVar43._4_4_ = (pfVar1[1] - fVar95) * fVar101;
          auVar43._8_4_ = (pfVar1[2] - fVar96) * fVar102;
          auVar43._12_4_ = (pfVar1[3] - fVar97) * fVar103;
          pfVar1 = (float *)((long)pauVar19[2] + uVar14);
          auVar79._0_4_ = (*pfVar1 - fVar40) * fVar122;
          auVar79._4_4_ = (pfVar1[1] - fVar98) * fVar58;
          auVar79._8_4_ = (pfVar1[2] - fVar99) * fVar59;
          auVar79._12_4_ = (pfVar1[3] - fVar100) * fVar60;
          auVar43 = maxps(auVar43,auVar79);
          pfVar1 = (float *)((long)pauVar19[2] + uVar15);
          auVar85._0_4_ = (*pfVar1 - fVar41) * fVar124;
          auVar85._4_4_ = (pfVar1[1] - fVar126) * fVar92;
          auVar85._8_4_ = (pfVar1[2] - fVar131) * fVar93;
          auVar85._12_4_ = (pfVar1[3] - fVar42) * fVar94;
          auVar61 = maxps(auVar85,auVar75);
          _local_10f8 = maxps(auVar43,auVar61);
          pfVar1 = (float *)((long)pauVar19[2] + uVar18);
          auVar91._0_4_ = (*pfVar1 - fVar118) * fVar112;
          auVar91._4_4_ = (pfVar1[1] - fVar95) * fVar74;
          auVar91._8_4_ = (pfVar1[2] - fVar96) * fVar80;
          auVar91._12_4_ = (pfVar1[3] - fVar97) * fVar81;
          pfVar1 = (float *)((long)pauVar19[2] + uVar13);
          auVar68._0_4_ = (*pfVar1 - fVar40) * fVar113;
          auVar68._4_4_ = (pfVar1[1] - fVar98) * fVar55;
          auVar68._8_4_ = (pfVar1[2] - fVar99) * fVar56;
          auVar68._12_4_ = (pfVar1[3] - fVar100) * fVar57;
          auVar43 = minps(auVar91,auVar68);
          pfVar1 = (float *)((long)pauVar19[2] + uVar22);
          auVar69._0_4_ = (*pfVar1 - fVar41) * fVar114;
          auVar69._4_4_ = (pfVar1[1] - fVar126) * fVar82;
          auVar69._8_4_ = (pfVar1[2] - fVar131) * fVar83;
          auVar69._12_4_ = (pfVar1[3] - fVar42) * fVar89;
          auVar61 = minps(auVar69,auVar87);
          auVar43 = minps(auVar43,auVar61);
          auVar61._4_4_ = -(uint)(local_10f8._4_4_ <= auVar43._4_4_);
          auVar61._0_4_ = -(uint)(local_10f8._0_4_ <= auVar43._0_4_);
          auVar61._8_4_ = -(uint)(local_10f8._8_4_ <= auVar43._8_4_);
          auVar61._12_4_ = -(uint)(local_10f8._12_4_ <= auVar43._12_4_);
          uVar23 = movmskps((int)pauVar8,auVar61);
          if (uVar23 == 0) goto LAB_0056e168;
          uVar23 = uVar23 & 0xff;
          uVar20 = (ulong)pauVar19 & 0xfffffffffffffff0;
          lVar12 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          pauVar8 = *(undefined1 (**) [16])(uVar20 + lVar12 * 8);
          uVar23 = uVar23 - 1 & uVar23;
          pauVar19 = pauVar8;
          if (uVar23 != 0) {
            uVar25 = *(uint *)(local_10f8 + lVar12 * 4);
            lVar12 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            pauVar19 = *(undefined1 (**) [16])(uVar20 + lVar12 * 8);
            uVar29 = *(uint *)(local_10f8 + lVar12 * 4);
            uVar23 = uVar23 - 1 & uVar23;
            uVar14 = local_1250;
            uVar15 = local_1258;
            if (uVar23 == 0) {
              if (uVar25 < uVar29) {
                *(undefined1 (**) [16])*pauVar17 = pauVar19;
                *(uint *)((long)*pauVar17 + 8) = uVar29;
                pauVar17 = pauVar17 + 1;
                pauVar19 = pauVar8;
              }
              else {
                *(undefined1 (**) [16])*pauVar17 = pauVar8;
                *(uint *)((long)*pauVar17 + 8) = uVar25;
                pauVar8 = pauVar19;
                pauVar17 = pauVar17 + 1;
              }
            }
            else {
              auVar44._8_4_ = uVar25;
              auVar44._0_8_ = pauVar8;
              auVar44._12_4_ = 0;
              auVar62._8_4_ = uVar29;
              auVar62._0_8_ = pauVar19;
              auVar62._12_4_ = 0;
              lVar12 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              uVar11 = *(ulong *)(uVar20 + lVar12 * 8);
              iVar7 = *(int *)(local_10f8 + lVar12 * 4);
              auVar70._8_4_ = iVar7;
              auVar70._0_8_ = uVar11;
              auVar70._12_4_ = 0;
              auVar76._8_4_ = -(uint)((int)uVar25 < (int)uVar29);
              uVar23 = uVar23 - 1 & uVar23;
              fVar55 = fStack_1194;
              fVar56 = fStack_1190;
              fVar57 = fStack_118c;
              fVar113 = local_1198;
              if (uVar23 == 0) {
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                auVar43 = auVar44 & auVar76 | ~auVar76 & auVar62;
                auVar61 = auVar62 & auVar76 | ~auVar76 & auVar44;
                auVar77._8_4_ = -(uint)(auVar43._8_4_ < iVar7);
                auVar77._0_8_ = CONCAT44(auVar77._8_4_,auVar77._8_4_);
                auVar77._12_4_ = auVar77._8_4_;
                pauVar8 = (undefined1 (*) [16])
                          (~auVar77._0_8_ & uVar11 | auVar43._0_8_ & auVar77._0_8_);
                auVar43 = auVar70 & auVar77 | ~auVar77 & auVar43;
                auVar45._8_4_ = -(uint)(auVar61._8_4_ < auVar43._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                *pauVar17 = ~auVar45 & auVar61 | auVar43 & auVar45;
                pauVar17[1] = auVar61 & auVar45 | ~auVar45 & auVar43;
                pauVar17 = pauVar17 + 2;
                pauVar19 = pauVar8;
              }
              else {
                lVar12 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                iVar6 = *(int *)(local_10f8 + lVar12 * 4);
                auVar84._8_4_ = iVar6;
                auVar84._0_8_ = *(undefined8 *)(uVar20 + lVar12 * 8);
                auVar84._12_4_ = 0;
                auVar78._4_4_ = auVar76._8_4_;
                auVar78._0_4_ = auVar76._8_4_;
                auVar78._8_4_ = auVar76._8_4_;
                auVar78._12_4_ = auVar76._8_4_;
                auVar43 = auVar44 & auVar78 | ~auVar78 & auVar62;
                auVar61 = auVar62 & auVar78 | ~auVar78 & auVar44;
                auVar90._0_4_ = -(uint)(iVar7 < iVar6);
                auVar90._4_4_ = -(uint)(iVar7 < iVar6);
                auVar90._8_4_ = -(uint)(iVar7 < iVar6);
                auVar90._12_4_ = -(uint)(iVar7 < iVar6);
                auVar79 = auVar70 & auVar90 | ~auVar90 & auVar84;
                auVar91 = ~auVar90 & auVar70 | auVar84 & auVar90;
                auVar71._8_4_ = -(uint)(auVar61._8_4_ < auVar91._8_4_);
                auVar71._4_4_ = auVar71._8_4_;
                auVar71._0_4_ = auVar71._8_4_;
                auVar71._12_4_ = auVar71._8_4_;
                auVar85 = auVar61 & auVar71 | ~auVar71 & auVar91;
                auVar63._8_4_ = -(uint)(auVar43._8_4_ < auVar79._8_4_);
                auVar63._0_8_ = CONCAT44(auVar63._8_4_,auVar63._8_4_);
                auVar63._12_4_ = auVar63._8_4_;
                pauVar8 = (undefined1 (*) [16])
                          (auVar43._0_8_ & auVar63._0_8_ | ~auVar63._0_8_ & auVar79._0_8_);
                auVar43 = ~auVar63 & auVar43 | auVar79 & auVar63;
                auVar46._8_4_ = -(uint)(auVar43._8_4_ < auVar85._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                *pauVar17 = ~auVar71 & auVar61 | auVar91 & auVar71;
                pauVar17[1] = ~auVar46 & auVar43 | auVar85 & auVar46;
                pauVar17[2] = auVar43 & auVar46 | ~auVar46 & auVar85;
                pauVar17 = pauVar17 + 3;
                pauVar19 = pauVar8;
                fVar122 = local_1108;
                fVar58 = fStack_1104;
                fVar59 = fStack_1100;
                fVar60 = fStack_10fc;
                fVar112 = local_1118;
                fVar74 = fStack_1114;
                fVar80 = fStack_1110;
                fVar81 = fStack_110c;
              }
            }
          }
        }
        uVar20 = (ulong)((uint)pauVar19 & 0xf) - 8;
        local_1180 = uVar20;
        uVar21 = (ulong)pauVar19 & 0xfffffffffffffff0;
        uVar11 = 0;
        while (uVar11 != local_1180) {
          local_1248 = uVar11 * 0xb0;
          fVar126 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar131 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar118 = (ray->super_RayK<1>).org.field_0.m128[2];
          pfVar1 = (float *)(uVar21 + local_1248);
          pfVar2 = (float *)(uVar21 + 0x10 + local_1248);
          pfVar3 = (float *)(uVar21 + 0x20 + local_1248);
          pfVar4 = (float *)(uVar21 + 0x30 + local_1248);
          fVar102 = *pfVar1 - fVar126;
          fVar105 = pfVar1[1] - fVar126;
          fStack_11a0 = pfVar1[2] - fVar126;
          fStack_119c = pfVar1[3] - fVar126;
          fVar83 = *pfVar2 - fVar131;
          fVar89 = pfVar2[1] - fVar131;
          fStack_1210 = pfVar2[2] - fVar131;
          fStack_120c = pfVar2[3] - fVar131;
          local_11b8 = *pfVar3 - fVar118;
          fStack_11b4 = pfVar3[1] - fVar118;
          fStack_11b0 = pfVar3[2] - fVar118;
          fStack_11ac = pfVar3[3] - fVar118;
          fVar41 = *pfVar4 - fVar126;
          fVar112 = pfVar4[1] - fVar126;
          fVar55 = pfVar4[2] - fVar126;
          fVar58 = pfVar4[3] - fVar126;
          pfVar1 = (float *)(uVar21 + 0x40 + local_1248);
          fVar42 = *pfVar1 - fVar131;
          fVar114 = pfVar1[1] - fVar131;
          fVar56 = pfVar1[2] - fVar131;
          fVar59 = pfVar1[3] - fVar131;
          pfVar1 = (float *)(uVar21 + 0x50 + local_1248);
          fVar113 = *pfVar1 - fVar118;
          fVar124 = pfVar1[1] - fVar118;
          fVar57 = pfVar1[2] - fVar118;
          fVar60 = pfVar1[3] - fVar118;
          pfVar1 = (float *)(uVar21 + 0x60 + local_1248);
          fVar120 = *pfVar1 - fVar126;
          fVar123 = pfVar1[1] - fVar126;
          fVar125 = pfVar1[2] - fVar126;
          fVar126 = pfVar1[3] - fVar126;
          pfVar1 = (float *)(uVar21 + 0x70 + local_1248);
          fVar127 = *pfVar1 - fVar131;
          fVar129 = pfVar1[1] - fVar131;
          fVar130 = pfVar1[2] - fVar131;
          fVar131 = pfVar1[3] - fVar131;
          pfVar1 = (float *)(uVar21 + 0x80 + local_1248);
          fVar115 = *pfVar1 - fVar118;
          fVar116 = pfVar1[1] - fVar118;
          fVar117 = pfVar1[2] - fVar118;
          fVar118 = pfVar1[3] - fVar118;
          fVar74 = fVar120 - fVar102;
          fVar80 = fVar123 - fVar105;
          fVar81 = fVar125 - fStack_11a0;
          fVar82 = fVar126 - fStack_119c;
          local_f98 = fVar127 - fVar83;
          fStack_f94 = fVar129 - fVar89;
          fStack_f90 = fVar130 - fStack_1210;
          fStack_f8c = fVar131 - fStack_120c;
          local_f88 = fVar115 - local_11b8;
          fStack_f84 = fVar116 - fStack_11b4;
          fStack_f80 = fVar117 - fStack_11b0;
          fStack_f7c = fVar118 - fStack_11ac;
          local_11a8 = CONCAT44(fVar105,fVar102);
          local_1228._4_4_ = fVar80;
          local_1228._0_4_ = fVar74;
          fStack_1220 = fVar81;
          fStack_121c = fVar82;
          fVar40 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fStack_1240 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fStack_11f0 = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar122 = (local_f98 * (local_11b8 + fVar115) - (fVar83 + fVar127) * local_f88) * fVar40 +
                    ((fVar102 + fVar120) * local_f88 - (local_11b8 + fVar115) * fVar74) *
                    fStack_1240 +
                    (fVar74 * (fVar83 + fVar127) - (fVar102 + fVar120) * local_f98) * fStack_11f0;
          fVar119 = (fStack_f94 * (fStack_11b4 + fVar116) - (fVar89 + fVar129) * fStack_f84) *
                    fVar40 + ((fVar105 + fVar123) * fStack_f84 - (fStack_11b4 + fVar116) * fVar80) *
                             fStack_1240 +
                             (fVar80 * (fVar89 + fVar129) - (fVar105 + fVar123) * fStack_f94) *
                             fStack_11f0;
          local_fc8._0_8_ = CONCAT44(fVar119,fVar122);
          local_fc8._8_4_ =
               (fStack_f90 * (fStack_11b0 + fVar117) - (fStack_1210 + fVar130) * fStack_f80) *
               fVar40 + ((fStack_11a0 + fVar125) * fStack_f80 - (fStack_11b0 + fVar117) * fVar81) *
                        fStack_1240 +
                        (fVar81 * (fStack_1210 + fVar130) - (fStack_11a0 + fVar125) * fStack_f90) *
                        fStack_11f0;
          local_fc8._12_4_ =
               (fStack_f8c * (fStack_11ac + fVar118) - (fStack_120c + fVar131) * fStack_f7c) *
               fVar40 + ((fStack_119c + fVar126) * fStack_f7c - (fStack_11ac + fVar118) * fVar82) *
                        fStack_1240 +
                        (fVar82 * (fStack_120c + fVar131) - (fStack_119c + fVar126) * fStack_f8c) *
                        fStack_11f0;
          fVar103 = fVar102 - fVar41;
          fVar106 = fVar105 - fVar112;
          fVar108 = fStack_11a0 - fVar55;
          fVar110 = fStack_119c - fVar58;
          fVar98 = fVar83 - fVar42;
          fVar99 = fVar89 - fVar114;
          fVar100 = fStack_1210 - fVar56;
          fVar101 = fStack_120c - fVar59;
          fVar92 = local_11b8 - fVar113;
          fVar94 = fStack_11b4 - fVar124;
          fVar96 = fStack_11b0 - fVar57;
          fVar97 = fStack_11ac - fVar60;
          local_1218 = (Geometry *)CONCAT44(fVar89,fVar83);
          local_fb8._0_4_ =
               (fVar98 * (local_11b8 + fVar113) - (fVar83 + fVar42) * fVar92) * fVar40 +
               ((fVar102 + fVar41) * fVar92 - (local_11b8 + fVar113) * fVar103) * fStack_1240 +
               (fVar103 * (fVar83 + fVar42) - (fVar102 + fVar41) * fVar98) * fStack_11f0;
          local_fb8._4_4_ =
               (fVar99 * (fStack_11b4 + fVar124) - (fVar89 + fVar114) * fVar94) * fVar40 +
               ((fVar105 + fVar112) * fVar94 - (fStack_11b4 + fVar124) * fVar106) * fStack_1240 +
               (fVar106 * (fVar89 + fVar114) - (fVar105 + fVar112) * fVar99) * fStack_11f0;
          local_fb8._8_4_ =
               (fVar100 * (fStack_11b0 + fVar57) - (fStack_1210 + fVar56) * fVar96) * fVar40 +
               ((fStack_11a0 + fVar55) * fVar96 - (fStack_11b0 + fVar57) * fVar108) * fStack_1240 +
               (fVar108 * (fStack_1210 + fVar56) - (fStack_11a0 + fVar55) * fVar100) * fStack_11f0;
          local_fb8._12_4_ =
               (fVar101 * (fStack_11ac + fVar60) - (fStack_120c + fVar59) * fVar97) * fVar40 +
               ((fStack_119c + fVar58) * fVar97 - (fStack_11ac + fVar60) * fVar110) * fStack_1240 +
               (fVar110 * (fStack_120c + fVar59) - (fStack_119c + fVar58) * fVar101) * fStack_11f0;
          local_fa8 = fVar41 - fVar120;
          fStack_fa4 = fVar112 - fVar123;
          fStack_fa0 = fVar55 - fVar125;
          fStack_f9c = fVar58 - fVar126;
          fVar93 = fVar42 - fVar127;
          fVar95 = fVar114 - fVar129;
          fStack_1200 = fVar56 - fVar130;
          fStack_11fc = fVar59 - fVar131;
          fVar104 = fVar113 - fVar115;
          fVar107 = fVar124 - fVar116;
          fVar109 = fVar57 - fVar117;
          fVar111 = fVar60 - fVar118;
          local_1208 = (Geometry *)CONCAT44(fVar95,fVar93);
          local_11f8 = (Scene *)CONCAT44(fStack_11f0,fStack_11f0);
          fStack_11ec = fStack_11f0;
          auVar64._0_4_ =
               (fVar93 * (fVar115 + fVar113) - (fVar127 + fVar42) * fVar104) * fVar40 +
               ((fVar120 + fVar41) * fVar104 - (fVar115 + fVar113) * local_fa8) * fStack_1240 +
               (local_fa8 * (fVar127 + fVar42) - (fVar120 + fVar41) * fVar93) * fStack_11f0;
          auVar64._4_4_ =
               (fVar95 * (fVar116 + fVar124) - (fVar129 + fVar114) * fVar107) * fVar40 +
               ((fVar123 + fVar112) * fVar107 - (fVar116 + fVar124) * fStack_fa4) * fStack_1240 +
               (fStack_fa4 * (fVar129 + fVar114) - (fVar123 + fVar112) * fVar95) * fStack_11f0;
          auVar64._8_4_ =
               (fStack_1200 * (fVar117 + fVar57) - (fVar130 + fVar56) * fVar109) * fVar40 +
               ((fVar125 + fVar55) * fVar109 - (fVar117 + fVar57) * fStack_fa0) * fStack_1240 +
               (fStack_fa0 * (fVar130 + fVar56) - (fVar125 + fVar55) * fStack_1200) * fStack_11f0;
          auVar64._12_4_ =
               (fStack_11fc * (fVar118 + fVar60) - (fVar131 + fVar59) * fVar111) * fVar40 +
               ((fVar126 + fVar58) * fVar111 - (fVar118 + fVar60) * fStack_f9c) * fStack_1240 +
               (fStack_f9c * (fVar131 + fVar59) - (fVar126 + fVar58) * fStack_11fc) * fStack_11f0;
          local_10d8._0_4_ = local_fb8._0_4_ + fVar122 + auVar64._0_4_;
          local_10d8._4_4_ = local_fb8._4_4_ + fVar119 + auVar64._4_4_;
          local_10d8._8_4_ = local_fb8._8_4_ + local_fc8._8_4_ + auVar64._8_4_;
          local_10d8._12_4_ = local_fb8._12_4_ + local_fc8._12_4_ + auVar64._12_4_;
          auVar86._8_4_ = local_fc8._8_4_;
          auVar86._0_8_ = local_fc8._0_8_;
          auVar86._12_4_ = local_fc8._12_4_;
          auVar75 = minps(auVar86,local_fb8);
          auVar87 = minps(auVar75,auVar64);
          auVar75 = maxps(local_fc8,local_fb8);
          auVar75 = maxps(auVar75,auVar64);
          fVar126 = ABS(local_10d8._0_4_) * 1.1920929e-07;
          fVar131 = ABS(local_10d8._4_4_) * 1.1920929e-07;
          fVar118 = ABS(local_10d8._8_4_) * 1.1920929e-07;
          fVar41 = ABS(local_10d8._12_4_) * 1.1920929e-07;
          auVar47._4_4_ = -(uint)(auVar75._4_4_ <= fVar131);
          auVar47._0_4_ = -(uint)(auVar75._0_4_ <= fVar126);
          auVar47._8_4_ = -(uint)(auVar75._8_4_ <= fVar118);
          auVar47._12_4_ = -(uint)(auVar75._12_4_ <= fVar41);
          auVar88._4_4_ = -(uint)(-fVar131 <= auVar87._4_4_);
          auVar88._0_4_ = -(uint)(-fVar126 <= auVar87._0_4_);
          auVar88._8_4_ = -(uint)(-fVar118 <= auVar87._8_4_);
          auVar88._12_4_ = -(uint)(-fVar41 <= auVar87._12_4_);
          auVar47 = auVar47 | auVar88;
          auVar48._0_4_ = auVar47._0_4_ & local_1048;
          auVar48._4_4_ = auVar47._4_4_ & uStack_1044;
          auVar48._8_4_ = auVar47._8_4_ & uStack_1040;
          auVar48._12_4_ = auVar47._12_4_ & uStack_103c;
          uVar23 = movmskps((int)uVar20,auVar48);
          uVar20 = (ulong)uVar23;
          local_11a8 = uVar11;
          if (uVar23 != 0) {
            _local_1228 = local_10d8;
            uVar25 = -(uint)(ABS(fVar92 * fVar93) <= ABS(fVar98 * local_f88));
            uVar26 = -(uint)(ABS(fVar94 * fVar95) <= ABS(fVar99 * fStack_f84));
            uVar30 = -(uint)(ABS(fVar96 * fStack_1200) <= ABS(fVar100 * fStack_f80));
            uVar33 = -(uint)(ABS(fVar97 * fStack_11fc) <= ABS(fVar101 * fStack_f7c));
            uVar29 = -(uint)(ABS(fVar103 * fVar104) <= ABS(fVar92 * fVar74));
            uVar27 = -(uint)(ABS(fVar106 * fVar107) <= ABS(fVar94 * fVar80));
            uVar31 = -(uint)(ABS(fVar108 * fVar109) <= ABS(fVar96 * fVar81));
            uVar34 = -(uint)(ABS(fVar110 * fVar111) <= ABS(fVar97 * fVar82));
            uVar24 = -(uint)(ABS(fVar98 * local_fa8) <= ABS(fVar103 * local_f98));
            uVar28 = -(uint)(ABS(fVar99 * fStack_fa4) <= ABS(fVar106 * fStack_f94));
            uVar32 = -(uint)(ABS(fVar100 * fStack_fa0) <= ABS(fVar108 * fStack_f90));
            uVar35 = -(uint)(ABS(fVar101 * fStack_f9c) <= ABS(fVar110 * fStack_f8c));
            local_1078[0] =
                 (float)(~uVar25 & (uint)(local_f98 * fVar92 - fVar98 * local_f88) |
                        (uint)(fVar98 * fVar104 - fVar92 * fVar93) & uVar25);
            local_1078[1] =
                 (float)(~uVar26 & (uint)(fStack_f94 * fVar94 - fVar99 * fStack_f84) |
                        (uint)(fVar99 * fVar107 - fVar94 * fVar95) & uVar26);
            local_1078[2] =
                 (float)(~uVar30 & (uint)(fStack_f90 * fVar96 - fVar100 * fStack_f80) |
                        (uint)(fVar100 * fVar109 - fVar96 * fStack_1200) & uVar30);
            local_1078[3] =
                 (float)(~uVar33 & (uint)(fStack_f8c * fVar97 - fVar101 * fStack_f7c) |
                        (uint)(fVar101 * fVar111 - fVar97 * fStack_11fc) & uVar33);
            local_1068[0] =
                 (float)(~uVar29 & (uint)(local_f88 * fVar103 - fVar92 * fVar74) |
                        (uint)(fVar92 * local_fa8 - fVar103 * fVar104) & uVar29);
            local_1068[1] =
                 (float)(~uVar27 & (uint)(fStack_f84 * fVar106 - fVar94 * fVar80) |
                        (uint)(fVar94 * fStack_fa4 - fVar106 * fVar107) & uVar27);
            local_1068[2] =
                 (float)(~uVar31 & (uint)(fStack_f80 * fVar108 - fVar96 * fVar81) |
                        (uint)(fVar96 * fStack_fa0 - fVar108 * fVar109) & uVar31);
            local_1068[3] =
                 (float)(~uVar34 & (uint)(fStack_f7c * fVar110 - fVar97 * fVar82) |
                        (uint)(fVar97 * fStack_f9c - fVar110 * fVar111) & uVar34);
            local_1058[0] =
                 (float)(~uVar24 & (uint)(fVar74 * fVar98 - fVar103 * local_f98) |
                        (uint)(fVar103 * fVar93 - fVar98 * local_fa8) & uVar24);
            local_1058[1] =
                 (float)(~uVar28 & (uint)(fVar80 * fVar99 - fVar106 * fStack_f94) |
                        (uint)(fVar106 * fVar95 - fVar99 * fStack_fa4) & uVar28);
            local_1058[2] =
                 (float)(~uVar32 & (uint)(fVar81 * fVar100 - fVar108 * fStack_f90) |
                        (uint)(fVar108 * fStack_1200 - fVar100 * fStack_fa0) & uVar32);
            local_1058[3] =
                 (float)(~uVar35 & (uint)(fVar82 * fVar101 - fVar110 * fStack_f8c) |
                        (uint)(fVar110 * fStack_11fc - fVar101 * fStack_f9c) & uVar35);
            fVar126 = fVar40 * local_1078[0] +
                      fStack_1240 * local_1068[0] + fStack_11f0 * local_1058[0];
            fVar131 = fVar40 * local_1078[1] +
                      fStack_1240 * local_1068[1] + fStack_11f0 * local_1058[1];
            fVar118 = fVar40 * local_1078[2] +
                      fStack_1240 * local_1068[2] + fStack_11f0 * local_1058[2];
            fVar40 = fVar40 * local_1078[3] +
                     fStack_1240 * local_1068[3] + fStack_11f0 * local_1058[3];
            auVar36._0_4_ = fVar126 + fVar126;
            auVar36._4_4_ = fVar131 + fVar131;
            auVar36._8_4_ = fVar118 + fVar118;
            auVar36._12_4_ = fVar40 + fVar40;
            auVar65._0_4_ = fVar83 * local_1068[0] + local_11b8 * local_1058[0];
            auVar65._4_4_ = fVar89 * local_1068[1] + fStack_11b4 * local_1058[1];
            auVar65._8_4_ = fStack_1210 * local_1068[2] + fStack_11b0 * local_1058[2];
            auVar65._12_4_ = fStack_120c * local_1068[3] + fStack_11ac * local_1058[3];
            fVar131 = fVar102 * local_1078[0] + auVar65._0_4_;
            fVar42 = fVar105 * local_1078[1] + auVar65._4_4_;
            fVar113 = fStack_11a0 * local_1078[2] + auVar65._8_4_;
            fVar112 = fStack_119c * local_1078[3] + auVar65._12_4_;
            auVar75 = rcpps(auVar65,auVar36);
            fVar126 = auVar75._0_4_;
            fVar118 = auVar75._4_4_;
            fVar40 = auVar75._8_4_;
            fVar41 = auVar75._12_4_;
            fVar131 = ((1.0 - auVar36._0_4_ * fVar126) * fVar126 + fVar126) * (fVar131 + fVar131);
            fVar118 = ((1.0 - auVar36._4_4_ * fVar118) * fVar118 + fVar118) * (fVar42 + fVar42);
            fVar40 = ((1.0 - auVar36._8_4_ * fVar40) * fVar40 + fVar40) * (fVar113 + fVar113);
            fVar41 = ((1.0 - auVar36._12_4_ * fVar41) * fVar41 + fVar41) * (fVar112 + fVar112);
            local_1228._0_4_ = (ray->super_RayK<1>).tfar;
            local_1228._4_4_ = (ray->super_RayK<1>).mask;
            fStack_1220 = (float)(ray->super_RayK<1>).id;
            fStack_121c = (float)(ray->super_RayK<1>).flags;
            fVar126 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar37._0_4_ =
                 (int)((uint)(auVar36._0_4_ != 0.0 &&
                             (fVar131 <= (float)local_1228._0_4_ && fVar126 <= fVar131)) *
                      -0x80000000) >> 0x1f;
            auVar37._4_4_ =
                 (int)((uint)(auVar36._4_4_ != 0.0 &&
                             (fVar118 <= (float)local_1228._0_4_ && fVar126 <= fVar118)) *
                      -0x80000000) >> 0x1f;
            auVar37._8_4_ =
                 (int)((uint)(auVar36._8_4_ != 0.0 &&
                             (fVar40 <= (float)local_1228._0_4_ && fVar126 <= fVar40)) * -0x80000000
                      ) >> 0x1f;
            auVar37._12_4_ =
                 (int)((uint)(auVar36._12_4_ != 0.0 &&
                             (fVar41 <= (float)local_1228._0_4_ && fVar126 <= fVar41)) * -0x80000000
                      ) >> 0x1f;
            auVar38 = auVar37 & auVar48;
            uVar23 = movmskps(uVar23,auVar38);
            uVar20 = (ulong)uVar23;
            if (uVar23 != 0) {
              local_10f8._8_4_ = local_fc8._8_4_;
              local_10f8._0_8_ = local_fc8._0_8_;
              fStack_10ec = local_fc8._12_4_;
              local_10e8 = local_fb8._0_4_;
              fStack_10e4 = local_fb8._4_4_;
              fStack_10e0 = local_fb8._8_4_;
              fStack_10dc = local_fb8._12_4_;
              local_10c8 = &local_1259;
              local_10b8 = auVar38;
              local_1088[0] = fVar131;
              local_1088[1] = fVar118;
              local_1088[2] = fVar40;
              local_1088[3] = fVar41;
              local_11f8 = context->scene;
              local_11e8 = auVar38;
              auVar75 = rcpps(auVar48,local_10d8);
              fVar126 = auVar75._0_4_;
              fVar42 = auVar75._4_4_;
              fVar113 = auVar75._8_4_;
              fVar112 = auVar75._12_4_;
              fVar126 = (float)(-(uint)(1e-18 <= ABS(local_10d8._0_4_)) &
                               (uint)(((float)DAT_01f46a60 - local_10d8._0_4_ * fVar126) * fVar126 +
                                     fVar126));
              fVar42 = (float)(-(uint)(1e-18 <= ABS(local_10d8._4_4_)) &
                              (uint)((DAT_01f46a60._4_4_ - local_10d8._4_4_ * fVar42) * fVar42 +
                                    fVar42));
              fVar113 = (float)(-(uint)(1e-18 <= ABS(local_10d8._8_4_)) &
                               (uint)((DAT_01f46a60._8_4_ - local_10d8._8_4_ * fVar113) * fVar113 +
                                     fVar113));
              fVar112 = (float)(-(uint)(1e-18 <= ABS(local_10d8._12_4_)) &
                               (uint)((DAT_01f46a60._12_4_ - local_10d8._12_4_ * fVar112) * fVar112
                                     + fVar112));
              auVar121._0_4_ = fVar122 * fVar126;
              auVar121._4_4_ = fVar119 * fVar42;
              auVar121._8_4_ = local_fc8._8_4_ * fVar113;
              auVar121._12_4_ = local_fc8._12_4_ * fVar112;
              local_10a8 = minps(auVar121,_DAT_01f46a60);
              auVar128._0_4_ = fVar126 * local_fb8._0_4_;
              auVar128._4_4_ = fVar42 * local_fb8._4_4_;
              auVar128._8_4_ = fVar113 * local_fb8._8_4_;
              auVar128._12_4_ = fVar112 * local_fb8._12_4_;
              local_1098 = minps(auVar128,_DAT_01f46a60);
              uVar23 = auVar38._0_4_;
              uVar25 = auVar38._4_4_;
              uVar29 = auVar38._8_4_;
              uVar24 = auVar38._12_4_;
              auVar49._0_4_ = uVar23 & (uint)fVar131;
              auVar49._4_4_ = uVar25 & (uint)fVar118;
              auVar49._8_4_ = uVar29 & (uint)fVar40;
              auVar49._12_4_ = uVar24 & (uint)fVar41;
              auVar66._0_8_ = CONCAT44(~uVar25,~uVar23) & 0x7f8000007f800000;
              auVar66._8_4_ = ~uVar29 & 0x7f800000;
              auVar66._12_4_ = ~uVar24 & 0x7f800000;
              auVar66 = auVar66 | auVar49;
              auVar72._4_4_ = auVar66._0_4_;
              auVar72._0_4_ = auVar66._4_4_;
              auVar72._8_4_ = auVar66._12_4_;
              auVar72._12_4_ = auVar66._8_4_;
              auVar75 = minps(auVar72,auVar66);
              auVar50._0_8_ = auVar75._8_8_;
              auVar50._8_4_ = auVar75._0_4_;
              auVar50._12_4_ = auVar75._4_4_;
              auVar75 = minps(auVar50,auVar75);
              auVar51._0_8_ =
                   CONCAT44(-(uint)(auVar75._4_4_ == auVar66._4_4_) & uVar25,
                            -(uint)(auVar75._0_4_ == auVar66._0_4_) & uVar23);
              auVar51._8_4_ = -(uint)(auVar75._8_4_ == auVar66._8_4_) & uVar29;
              auVar51._12_4_ = -(uint)(auVar75._12_4_ == auVar66._12_4_) & uVar24;
              iVar7 = movmskps((int)context->scene,auVar51);
              if (iVar7 != 0) {
                auVar38._8_4_ = auVar51._8_4_;
                auVar38._0_8_ = auVar51._0_8_;
                auVar38._12_4_ = auVar51._12_4_;
              }
              local_1248 = local_1248 + uVar21;
              uVar20 = (ulong)(uint)local_1228._4_4_;
              uVar9 = movmskps((int)uVar11,auVar38);
              uVar11 = CONCAT44((int)(uVar11 >> 0x20),uVar9);
              lVar12 = 0;
              fStack_123c = fStack_1240;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
LAB_0056ea16:
              local_1130 = *(uint *)(local_1248 + 0x90 + lVar12 * 4);
              pGVar10 = (Geometry *)(ulong)local_1130;
              local_1218 = (local_11f8->geometries).items[(long)pGVar10].ptr;
              if ((local_1218->mask & (uint)uVar20) == 0) {
                *(undefined4 *)(local_11e8 + lVar12 * 4) = 0;
              }
              else {
                local_1208 = (Geometry *)context->args;
                if (((Geometry *)context->args)->device == (Device *)0x0) {
                  local_1178.context = context->user;
                  if (local_1218->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar126 = *(float *)(local_10a8 + lVar12 * 4);
                    fVar131 = local_1088[lVar12 + -4];
                    (ray->super_RayK<1>).tfar = local_1088[lVar12];
                    (ray->Ng).field_0.field_0.x = local_1078[lVar12];
                    (ray->Ng).field_0.field_0.y = local_1068[lVar12];
                    (ray->Ng).field_0.field_0.z = local_1058[lVar12];
                    ray->u = fVar126;
                    ray->v = fVar131;
                    ray->primID = *(uint *)(local_1248 + 0xa0 + lVar12 * 4);
                    ray->geomID = local_1130;
                    ray->instID[0] = (local_1178.context)->instID[0];
                    uVar20 = (ulong)(local_1178.context)->instPrimID[0];
                    ray->instPrimID[0] = (local_1178.context)->instPrimID[0];
                    goto LAB_0056ed85;
                  }
                }
                else {
                  local_1178.context = context->user;
                }
                local_1148 = local_1078[lVar12];
                local_1144 = local_1068[lVar12];
                local_1140 = local_1058[lVar12];
                local_113c = *(undefined4 *)(local_10a8 + lVar12 * 4);
                local_1138 = local_1088[lVar12 + -4];
                local_1134 = *(undefined4 *)(local_1248 + 0xa0 + lVar12 * 4);
                local_112c = (local_1178.context)->instID[0];
                local_1128 = (local_1178.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_1088[lVar12];
                local_122c = -1;
                local_1178.valid = &local_122c;
                pGVar10 = (Geometry *)local_1218->userPtr;
                local_1178.geometryUserPtr = pGVar10;
                local_1178.ray = (RTCRayN *)ray;
                local_1178.hit = (RTCHitN *)&local_1148;
                local_1178.N = 1;
                local_11b8 = fVar131;
                fStack_11b4 = fVar118;
                fStack_11b0 = fVar40;
                fStack_11ac = fVar41;
                if (((local_1218->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*local_1218->intersectionFilterN)(&local_1178), context = local_11c0,
                    ray = local_11c8, uVar14 = local_1250, uVar15 = local_1258, uVar16 = local_11d0,
                    fVar131 = local_11b8, fVar118 = fStack_11b4, fVar40 = fStack_11b0,
                    fVar41 = fStack_11ac, *local_1178.valid != 0)) &&
                   ((local_1208->device == (Device *)0x0 ||
                    (((pGVar10 = local_1208,
                      ((ulong)(local_1208->super_RefCount)._vptr_RefCount & 2) == 0 &&
                      (pGVar10 = local_1218, ((local_1218->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*(code *)local_1208->device)(&local_1178), context = local_11c0,
                     ray = local_11c8, uVar14 = local_1250, uVar15 = local_1258, uVar16 = local_11d0
                     , fVar131 = local_11b8, fVar118 = fStack_11b4, fVar40 = fStack_11b0,
                     fVar41 = fStack_11ac, *local_1178.valid != 0)))))) {
                  (((Vec3f *)((long)local_1178.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_1178.hit;
                  (((Vec3f *)((long)local_1178.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_1178.hit + 4);
                  (((Vec3f *)((long)local_1178.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_1178.hit + 8);
                  *(float *)((long)local_1178.ray + 0x3c) = *(float *)(local_1178.hit + 0xc);
                  *(float *)((long)local_1178.ray + 0x40) = *(float *)(local_1178.hit + 0x10);
                  *(float *)((long)local_1178.ray + 0x44) = *(float *)(local_1178.hit + 0x14);
                  *(float *)((long)local_1178.ray + 0x48) = *(float *)(local_1178.hit + 0x18);
                  *(float *)((long)local_1178.ray + 0x4c) = *(float *)(local_1178.hit + 0x1c);
                  pGVar10 = (Geometry *)(ulong)(uint)*(float *)(local_1178.hit + 0x20);
                  *(float *)((long)local_1178.ray + 0x50) = *(float *)(local_1178.hit + 0x20);
                  fVar131 = local_11b8;
                  fVar118 = fStack_11b4;
                  fVar40 = fStack_11b0;
                  fVar41 = fStack_11ac;
                }
                else {
                  (local_11c8->super_RayK<1>).tfar = (float)local_1228._0_4_;
                  context = local_11c0;
                  ray = local_11c8;
                  uVar14 = local_1250;
                  uVar15 = local_1258;
                  uVar16 = local_11d0;
                }
                *(undefined4 *)(local_11e8 + lVar12 * 4) = 0;
                local_1228._0_4_ = (ray->super_RayK<1>).tfar;
                local_1228._4_4_ = (ray->super_RayK<1>).mask;
                fStack_1220 = (float)(ray->super_RayK<1>).id;
                fStack_121c = (float)(ray->super_RayK<1>).flags;
                local_11e8._0_4_ = -(uint)(fVar131 <= (float)local_1228._0_4_) & local_11e8._0_4_;
                local_11e8._4_4_ = -(uint)(fVar118 <= (float)local_1228._0_4_) & local_11e8._4_4_;
                local_11e8._8_4_ = -(uint)(fVar40 <= (float)local_1228._0_4_) & local_11e8._8_4_;
                local_11e8._12_4_ = -(uint)(fVar41 <= (float)local_1228._0_4_) & local_11e8._12_4_;
                uVar20 = (ulong)(uint)(ray->super_RayK<1>).mask;
              }
              iVar7 = movmskps((int)pGVar10,local_11e8);
              if (iVar7 == 0) goto LAB_0056ed85;
              uVar23 = local_11e8._0_4_;
              uVar25 = local_11e8._4_4_;
              uVar29 = local_11e8._8_4_;
              uVar24 = local_11e8._12_4_;
              auVar52._0_4_ = uVar23 & (uint)fVar131;
              auVar52._4_4_ = uVar25 & (uint)fVar118;
              auVar52._8_4_ = uVar29 & (uint)fVar40;
              auVar52._12_4_ = uVar24 & (uint)fVar41;
              auVar67._0_8_ = CONCAT44(~uVar25,~uVar23) & 0x7f8000007f800000;
              auVar67._8_4_ = ~uVar29 & 0x7f800000;
              auVar67._12_4_ = ~uVar24 & 0x7f800000;
              auVar67 = auVar67 | auVar52;
              auVar73._4_4_ = auVar67._0_4_;
              auVar73._0_4_ = auVar67._4_4_;
              auVar73._8_4_ = auVar67._12_4_;
              auVar73._12_4_ = auVar67._8_4_;
              auVar75 = minps(auVar73,auVar67);
              auVar53._0_8_ = auVar75._8_8_;
              auVar53._8_4_ = auVar75._0_4_;
              auVar53._12_4_ = auVar75._4_4_;
              auVar75 = minps(auVar53,auVar75);
              auVar54._0_8_ =
                   CONCAT44(-(uint)(auVar75._4_4_ == auVar67._4_4_) & uVar25,
                            -(uint)(auVar75._0_4_ == auVar67._0_4_) & uVar23);
              auVar54._8_4_ = -(uint)(auVar75._8_4_ == auVar67._8_4_) & uVar29;
              auVar54._12_4_ = -(uint)(auVar75._12_4_ == auVar67._12_4_) & uVar24;
              iVar7 = movmskps(iVar7,auVar54);
              auVar39 = local_11e8;
              if (iVar7 != 0) {
                auVar39._8_4_ = auVar54._8_4_;
                auVar39._0_8_ = auVar54._0_8_;
                auVar39._12_4_ = auVar54._12_4_;
              }
              uVar9 = movmskps(iVar7,auVar39);
              uVar11 = CONCAT44((int)((ulong)pGVar10 >> 0x20),uVar9);
              lVar12 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              goto LAB_0056ea16;
            }
          }
LAB_0056ed85:
          fVar41 = local_fd8;
          fVar126 = fStack_fd4;
          fVar131 = fStack_fd0;
          fVar42 = fStack_fcc;
          auVar75 = local_ff8;
          fVar113 = local_1198;
          fVar55 = fStack_1194;
          fVar56 = fStack_1190;
          fVar57 = fStack_118c;
          fVar122 = local_1108;
          fVar58 = fStack_1104;
          fVar59 = fStack_1100;
          fVar60 = fStack_10fc;
          fVar112 = local_1118;
          fVar74 = fStack_1114;
          fVar80 = fStack_1110;
          fVar81 = fStack_110c;
          fVar114 = local_fe8;
          fVar82 = fStack_fe4;
          fVar83 = fStack_fe0;
          fVar89 = fStack_fdc;
          fVar124 = local_1008;
          fVar92 = fStack_1004;
          fVar93 = fStack_1000;
          fVar94 = fStack_ffc;
          fVar118 = local_1018;
          fVar95 = fStack_1014;
          fVar96 = fStack_1010;
          fVar97 = fStack_100c;
          fVar40 = local_1028;
          fVar98 = fStack_1024;
          fVar99 = fStack_1020;
          fVar100 = fStack_101c;
          fVar119 = local_1038;
          fVar101 = fStack_1034;
          fVar102 = fStack_1030;
          fVar103 = fStack_102c;
          uVar11 = local_11a8 + 1;
        }
        fVar104 = (ray->super_RayK<1>).tfar;
        auVar87._4_4_ = fVar104;
        auVar87._0_4_ = fVar104;
        auVar87._8_4_ = fVar104;
        auVar87._12_4_ = fVar104;
      }
      goto LAB_0056e168;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }